

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboCompletenessTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles3::Functional::NumSamplesParams::getDescription_abi_cxx11_
          (string *__return_storage_ptr__,NumSamplesParams *this,NumSamplesParams *params)

{
  int iVar1;
  bool bVar2;
  ostream *poVar3;
  int local_198;
  GLsizei ns;
  int i;
  bool first;
  ostringstream os;
  NumSamplesParams *params_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&i);
  bVar2 = true;
  for (local_198 = 0; local_198 < 3; local_198 = local_198 + 1) {
    iVar1 = this->numSamples[local_198];
    if (iVar1 != -2) {
      if (bVar2) {
        bVar2 = false;
      }
      else {
        std::operator<<((ostream *)&i,", ");
      }
      if (iVar1 == -1) {
        poVar3 = std::operator<<((ostream *)&i,"texture ");
        poVar3 = std::operator<<(poVar3,getDescription::s_names[local_198]);
        std::operator<<(poVar3," attachment");
      }
      else {
        poVar3 = (ostream *)std::ostream::operator<<(&i,iVar1);
        poVar3 = std::operator<<(poVar3,"-sample renderbuffer ");
        poVar3 = std::operator<<(poVar3,getDescription::s_names[local_198]);
        std::operator<<(poVar3," attachment");
      }
    }
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&i);
  return __return_storage_ptr__;
}

Assistant:

string NumSamplesParams::getDescription (const NumSamplesParams& params)
{
	ostringstream os;
	bool first = true;
	static const char* const s_names[] = { "color", "depth", "stencil" };
	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(s_names) == DE_LENGTH_OF_ARRAY(params.numSamples));

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_names); i++)
	{
		GLsizei ns = params.numSamples[i];

		if (ns == SAMPLES_NONE)
			continue;

		if (first)
			first = false;
		else
			os << ", ";

		if (ns == SAMPLES_TEXTURE)
			os << "texture " << s_names[i] << " attachment";
		else
			os << ns << "-sample renderbuffer " << s_names[i] << " attachment";
	}
	return os.str();
}